

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O3

void speech_prog_oze(CHAR_DATA *mob,CHAR_DATA *ch,char *speech)

{
  short *psVar1;
  undefined2 uVar2;
  PC_DATA *pPVar3;
  bool bVar4;
  int iVar5;
  AFFECT_DATA *pAVar6;
  CHAR_DATA *mob_local;
  int local_1414;
  CHAR_DATA *ch_local;
  void *local_1408;
  void *local_1400;
  string local_13f8;
  string local_13d8;
  string local_13b8;
  string local_1398;
  string local_1378;
  string local_1358;
  string local_1338;
  string local_1318;
  string local_12f8;
  string local_12d8;
  string local_12b8;
  string local_1298;
  string local_1278;
  string local_1258;
  char buf [4608];
  
  mob_local = mob;
  ch_local = ch;
  pAVar6 = affect_find(mob->affected,(int)gsn_greater_demon);
  if ((pAVar6 != (AFFECT_DATA *)0x0) && (pAVar6->owner == ch && pAVar6->owner != (CHAR_DATA *)0x0))
  {
    bVar4 = str_prefix("yes",speech);
    if (bVar4) {
      bVar4 = str_prefix("no",speech);
      if (bVar4) {
        do_say(mob,"The choice is a simple one, mortal.  Yes or no?");
        return;
      }
      sprintf(buf,"The abyss will not forget this treachery, %s.",ch->name);
      do_whisper(mob_local,buf);
      local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"speech_prog_oze","");
      local_13d8._M_dataplus._M_p = (pointer)&local_13d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_13d8,"act_queue","");
      local_1400 = (void *)0x0;
      local_1408 = (void *)0x0;
      local_1414 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[86],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,1,&local_12f8,&local_13d8,act_queue,
                 (char (*) [86])
                 "The puddle of gore before you that was once a greater demon dissolves into the earth."
                 ,&mob_local,&local_1400,&local_1408,&local_1414);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
        operator_delete(local_13d8._M_dataplus._M_p,local_13d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
        operator_delete(local_12f8._M_dataplus._M_p,local_12f8.field_2._M_allocated_capacity + 1);
      }
      local_1318._M_dataplus._M_p = (pointer)&local_1318.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1318,"speech_prog_oze","");
      local_13f8._M_dataplus._M_p = (pointer)&local_13f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_13f8,"delay_extract","");
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,2,&local_1318,&local_13f8,delay_extract,&mob_local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13f8._M_dataplus._M_p != &local_13f8.field_2) {
        operator_delete(local_13f8._M_dataplus._M_p,local_13f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1318._M_dataplus._M_p != &local_1318.field_2) {
        operator_delete(local_1318._M_dataplus._M_p,local_1318.field_2._M_allocated_capacity + 1);
      }
      ch->pcdata->greaterdata[0] = -1;
    }
    else {
      WAIT_STATE(ch,0x24);
      act("Eyes flickering with nearly extinguished flame, Oze incants a phrase.",mob,(void *)0x0,
          (void *)0x0,0);
      sprintf(buf,"\'siphon\' %s",ch->name);
      do_cast(mob_local,buf);
      stop_fighting(mob_local,true);
      local_1258._M_dataplus._M_p = (pointer)&local_1258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1258,"speech_prog_oze","");
      local_1338._M_dataplus._M_p = (pointer)&local_1338.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1338,"act_queue","");
      local_1400 = (void *)0x0;
      local_1408 = (void *)0x0;
      local_1414 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[79],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,3,&local_1258,&local_1338,act_queue,
                 (char (*) [79])
                 "Suddenly rejuvenated, Oze begins to growl deep in his torso of exposed organs.",
                 &mob_local,&local_1400,&local_1408,&local_1414);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1338._M_dataplus._M_p != &local_1338.field_2) {
        operator_delete(local_1338._M_dataplus._M_p,local_1338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
        operator_delete(local_1258._M_dataplus._M_p,local_1258.field_2._M_allocated_capacity + 1);
      }
      local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1278,"speech_prog_oze","");
      local_1358._M_dataplus._M_p = (pointer)&local_1358.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1358,"do_say_queue","");
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[174]>
                (&RS.Queue,5,&local_1278,&local_1358,do_say_queue,&mob_local,
                 (char (*) [174])
                 "I would say that your deed would be remembered... but as you were the one who put me here in the first place,  I doubt very much that you would wish it so.  I take my leave."
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1358._M_dataplus._M_p != &local_1358.field_2) {
        operator_delete(local_1358._M_dataplus._M_p,local_1358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
        operator_delete(local_1278._M_dataplus._M_p,local_1278.field_2._M_allocated_capacity + 1);
      }
      local_1298._M_dataplus._M_p = (pointer)&local_1298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1298,"speech_prog_oze","");
      local_1378._M_dataplus._M_p = (pointer)&local_1378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1378,"act_queue","");
      local_1400 = (void *)0x0;
      local_1408 = (void *)0x0;
      local_1414 = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[81],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (&RS.Queue,7,&local_1298,&local_1378,act_queue,
                 (char (*) [81])
                 "With a squelching sound, Oze thins into a gout of blood and shoots into the sky.",
                 &mob_local,&local_1400,&local_1408,&local_1414);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1378._M_dataplus._M_p != &local_1378.field_2) {
        operator_delete(local_1378._M_dataplus._M_p,local_1378.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
        operator_delete(local_1298._M_dataplus._M_p,local_1298.field_2._M_allocated_capacity + 1);
      }
      local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b8,"speech_prog_oze","");
      local_1398._M_dataplus._M_p = (pointer)&local_1398.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1398,"delay_extract","");
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,8,&local_12b8,&local_1398,delay_extract,&mob_local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1398._M_dataplus._M_p != &local_1398.field_2) {
        operator_delete(local_1398._M_dataplus._M_p,local_1398.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
        operator_delete(local_12b8._M_dataplus._M_p,local_12b8.field_2._M_allocated_capacity + 1);
      }
      local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_12d8,"speech_prog_oze","");
      local_13b8._M_dataplus._M_p = (pointer)&local_13b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b8,"save_char_obj","");
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (&RS.Queue,8,&local_12d8,&local_13b8,save_char_obj,&ch_local);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_13b8._M_dataplus._M_p != &local_13b8.field_2) {
        operator_delete(local_13b8._M_dataplus._M_p,local_13b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
        operator_delete(local_12d8._M_dataplus._M_p,local_12d8.field_2._M_allocated_capacity + 1);
      }
      pPVar3 = ch_local->pcdata;
      pPVar3->greaterdata[0] = 2;
      iVar5 = skill_lookup("leech");
      pPVar3->learned[iVar5] = 1;
      psVar1 = &ch_local->pcdata->perm_hit;
      *psVar1 = *psVar1 + -0x46;
      uVar2 = ch_local->max_hit;
      ch_local->max_hit = uVar2 + -0x46;
      ch_local->hit = (int)(short)(uVar2 + -0x46);
    }
  }
  return;
}

Assistant:

void speech_prog_oze(CHAR_DATA *mob, CHAR_DATA *ch, char *speech)
{
	AFFECT_DATA *af = affect_find(mob->affected, gsn_greater_demon);
	char buf[MSL];

	if (!af || !af->owner)
		return;

	if (ch != af->owner)
		return;

	if (!str_prefix("yes", speech))
	{
		WAIT_STATE(ch, 3 * PULSE_VIOLENCE);

		act("Eyes flickering with nearly extinguished flame, Oze incants a phrase.", mob, 0, 0, TO_ROOM);

		sprintf(buf, "'siphon' %s", ch->name);
		do_cast(mob, buf);

		stop_fighting(mob, true);

		RS.Queue.AddToQueue(3, "speech_prog_oze", "act_queue", act_queue, "Suddenly rejuvenated, Oze begins to growl deep in his torso of exposed organs.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(5, "speech_prog_oze", "do_say_queue", do_say_queue, mob, "I would say that your deed would be remembered... but as you were the one who put me here in the first place,  I doubt very much that you would wish it so.  I take my leave.");
		RS.Queue.AddToQueue(7, "speech_prog_oze", "act_queue", act_queue, "With a squelching sound, Oze thins into a gout of blood and shoots into the sky.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(8, "speech_prog_oze", "delay_extract", delay_extract, mob);
		RS.Queue.AddToQueue(8, "speech_prog_oze", "save_char_obj", save_char_obj, ch);
		ch->pcdata->greaterdata[GREATER_OZE] = FAVOR_GRANTED;
		ch->pcdata->learned[skill_lookup("leech")] = 1;
		ch->pcdata->perm_hit -= 70;
		ch->max_hit -= 70;
		ch->hit = ch->max_hit;
		return;
	}

	if (!str_prefix("no", speech))
	{
		sprintf(buf, "The abyss will not forget this treachery, %s.", ch->name);
		do_whisper(mob, buf);

		RS.Queue.AddToQueue(1, "speech_prog_oze", "act_queue", act_queue, "The puddle of gore before you that was once a greater demon dissolves into the earth.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(2, "speech_prog_oze", "delay_extract", delay_extract, mob);
		ch->pcdata->greaterdata[GREATER_OZE] = FAVOR_FAILED;
		return;
	}

	do_say(mob, "The choice is a simple one, mortal.  Yes or no?");
}